

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,t_label *a_label)

{
  t_emit *ptVar1;
  unsigned_long local_10;
  
  local_10 = (long)(this->v_code->v_instructions).
                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->v_code->v_instructions).
                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&local_10);
  ptVar1 = operator<<(this,0);
  return ptVar1;
}

Assistant:

t_emit& operator<<(t_label& a_label)
	{
		a_label.push_back(f_last());
		return *this << size_t(0);
	}